

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::StringMaker<char_const*,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<char_const*,void> *this,char *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  allocator<char> local_4d [20];
  allocator<char> local_39;
  string local_38 [32];
  StringMaker<char_const*,void> *local_18;
  char *str_local;
  
  local_18 = this;
  str_local = (char *)__return_storage_ptr__;
  if (this == (StringMaker<char_const*,void> *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"{null string}",local_4d);
    std::allocator<char>::~allocator((allocator<char> *)local_4d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,(char *)this,&local_39);
    Detail::stringify<std::__cxx11::string>(__return_storage_ptr__,(Detail *)local_38,e);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<char const*>::convert(char const* str) {
    if (str) {
        return ::Catch::Detail::stringify(std::string{ str });
    } else {
        return{ "{null string}" };
    }
}